

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O3

ModuleRecordList * __thiscall Js::JavascriptLibrary::EnsureModuleRecordList(JavascriptLibrary *this)

{
  ModuleRecordList *pMVar1;
  Recycler *alloc;
  List<Js::SourceTextModuleRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar2;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  pMVar1 = (this->moduleRecordList).ptr;
  if (pMVar1 != (ModuleRecordList *)0x0) {
    return pMVar1;
  }
  local_50 = (undefined1  [8])
             &JsUtil::
              List<Js::SourceTextModuleRecord*,Memory::Recycler,false,Js::CopyRemovePolicy,DefaultComparer>
              ::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_765c5cc;
  data.filename._0_4_ = 0x1c95;
  alloc = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_50);
  pLVar2 = (List<Js::SourceTextModuleRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            *)new<Memory::Recycler>(0x30,alloc,0x387914);
  (pLVar2->super_ReadOnlyList<Js::SourceTextModuleRecord_*,_Memory::Recycler,_DefaultComparer>).
  alloc = this->recycler;
  (pLVar2->super_ReadOnlyList<Js::SourceTextModuleRecord_*,_Memory::Recycler,_DefaultComparer>).
  _vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_014eb3e0;
  (pLVar2->super_ReadOnlyList<Js::SourceTextModuleRecord_*,_Memory::Recycler,_DefaultComparer>).
  buffer.ptr = (WriteBarrierPtr<Js::SourceTextModuleRecord> *)0x0;
  (pLVar2->super_ReadOnlyList<Js::SourceTextModuleRecord_*,_Memory::Recycler,_DefaultComparer>).
  count = 0;
  pLVar2->length = 0;
  pLVar2->increment = 4;
  Memory::Recycler::WBSetBit((char *)&this->moduleRecordList);
  (this->moduleRecordList).ptr = pLVar2;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->moduleRecordList);
  return (this->moduleRecordList).ptr;
}

Assistant:

ModuleRecordList* JavascriptLibrary::EnsureModuleRecordList()
    {
        if (moduleRecordList == nullptr)
        {
            moduleRecordList = RecyclerNew(recycler, ModuleRecordList, recycler);
        }
        return moduleRecordList;
    }